

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_csp.c
# Opt level: O1

void SharpYuvComputeConversionMatrix
               (SharpYuvColorSpace *yuv_color_space,SharpYuvConversionMatrix *matrix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined8 local_68;
  
  uVar1 = yuv_color_space->kr;
  uVar2 = yuv_color_space->kb;
  fVar10 = 1.0 - (float)uVar1;
  auVar9._4_4_ = 1.0 - (float)uVar2;
  auVar9._0_4_ = fVar10;
  auVar9._8_8_ = 0;
  auVar9 = divps(_DAT_001bd840,auVar9);
  local_68 = auVar9._0_8_;
  bVar3 = (byte)yuv_color_space->bit_depth;
  bVar4 = bVar3 - 8;
  if (yuv_color_space->range == kSharpYuvRangeLimited) {
    fVar5 = (float)~(-1 << (bVar3 & 0x1f));
    fVar11 = (float)(0xdb << (bVar4 & 0x1f)) / fVar5;
    fVar5 = (float)(0xe0 << (bVar4 & 0x1f)) / fVar5;
    local_68 = CONCAT44(auVar9._4_4_ * fVar5,auVar9._0_4_ * fVar5);
    fVar5 = (float)(0x10 << (bVar4 & 0x1f));
  }
  else {
    fVar11 = 1.0;
    fVar5 = 0.0;
  }
  fVar5 = floorf(fVar5 * 65536.0 + 0.5);
  fVar6 = floorf((float)uVar2 * fVar11 * 65536.0 + 0.5);
  fVar7 = floorf(fVar11 * (float)uVar1 * 65536.0 + 0.5);
  fVar11 = floorf(fVar11 * (fVar10 - (float)uVar2) * 65536.0 + 0.5);
  matrix->rgb_to_y[0] = (int)fVar7;
  matrix->rgb_to_y[1] = (int)fVar11;
  matrix->rgb_to_y[2] = (int)fVar6;
  matrix->rgb_to_y[3] = (int)fVar5;
  fVar8 = -(fVar10 - (float)uVar2);
  fVar5 = floorf((float)(0x80 << (bVar4 & 0x1f)) * 65536.0 + 0.5);
  fVar11 = floorf((1.0 - (float)uVar2) * local_68._4_4_ * 65536.0 + 0.5);
  fVar6 = floorf(-(float)uVar1 * local_68._4_4_ * 65536.0 + 0.5);
  fVar7 = floorf(fVar8 * local_68._4_4_ * 65536.0 + 0.5);
  matrix->rgb_to_u[0] = (int)fVar6;
  matrix->rgb_to_u[1] = (int)fVar7;
  matrix->rgb_to_u[2] = (int)fVar11;
  matrix->rgb_to_u[3] = (int)fVar5;
  fVar10 = floorf((float)local_68 * fVar10 * 65536.0 + 0.5);
  fVar5 = floorf((float)local_68 * fVar8 * 65536.0 + 0.5);
  *(ulong *)matrix->rgb_to_v = CONCAT44((int)fVar5,(int)fVar10);
  fVar10 = floorf(0.5 - (float)uVar2 * (float)local_68 * 65536.0);
  matrix->rgb_to_v[2] = (int)fVar10;
  matrix->rgb_to_v[3] = (int)fVar7;
  return;
}

Assistant:

void SharpYuvComputeConversionMatrix(const SharpYuvColorSpace* yuv_color_space,
                                     SharpYuvConversionMatrix* matrix) {
  const float kr = yuv_color_space->kr;
  const float kb = yuv_color_space->kb;
  const float kg = 1.0f - kr - kb;
  const float cb = 0.5f / (1.0f - kb);
  const float cr = 0.5f / (1.0f - kr);

  const int shift = yuv_color_space->bit_depth - 8;

  const float denom = (float)((1 << yuv_color_space->bit_depth) - 1);
  float scale_y = 1.0f;
  float add_y = 0.0f;
  float scale_u = cb;
  float scale_v = cr;
  float add_uv = (float)(128 << shift);
  assert(yuv_color_space->bit_depth >= 8);

  if (yuv_color_space->range == kSharpYuvRangeLimited) {
    scale_y *= (219 << shift) / denom;
    scale_u *= (224 << shift) / denom;
    scale_v *= (224 << shift) / denom;
    add_y = (float)(16 << shift);
  }

  matrix->rgb_to_y[0] = ToFixed16(kr * scale_y);
  matrix->rgb_to_y[1] = ToFixed16(kg * scale_y);
  matrix->rgb_to_y[2] = ToFixed16(kb * scale_y);
  matrix->rgb_to_y[3] = ToFixed16(add_y);

  matrix->rgb_to_u[0] = ToFixed16(-kr * scale_u);
  matrix->rgb_to_u[1] = ToFixed16(-kg * scale_u);
  matrix->rgb_to_u[2] = ToFixed16((1 - kb) * scale_u);
  matrix->rgb_to_u[3] = ToFixed16(add_uv);

  matrix->rgb_to_v[0] = ToFixed16((1 - kr) * scale_v);
  matrix->rgb_to_v[1] = ToFixed16(-kg * scale_v);
  matrix->rgb_to_v[2] = ToFixed16(-kb * scale_v);
  matrix->rgb_to_v[3] = ToFixed16(add_uv);
}